

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Planner.cpp
# Opt level: O1

void __thiscall Planner::Planner(Planner *this,string *nume)

{
  pointer pcVar1;
  
  this->_vptr_Planner = (_func_int **)&PTR__Planner_0010dcb0;
  (this->nume)._M_dataplus._M_p = (pointer)&(this->nume).field_2;
  pcVar1 = (nume->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->nume,pcVar1,pcVar1 + nume->_M_string_length);
  (this->Backlogs).
  super__Vector_base<std::shared_ptr<Backlog>,_std::allocator<std::shared_ptr<Backlog>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Backlogs).
  super__Vector_base<std::shared_ptr<Backlog>,_std::allocator<std::shared_ptr<Backlog>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Liste).super__Vector_base<std::shared_ptr<Lista>,_std::allocator<std::shared_ptr<Lista>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Backlogs).
  super__Vector_base<std::shared_ptr<Backlog>,_std::allocator<std::shared_ptr<Backlog>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Liste).super__Vector_base<std::shared_ptr<Lista>,_std::allocator<std::shared_ptr<Lista>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Liste).super__Vector_base<std::shared_ptr<Lista>,_std::allocator<std::shared_ptr<Lista>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

Planner::Planner(const std::string &nume) : nume(nume) {}